

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::ParseSimpleFile
               (string_view path,LineConsumer *line_consumer,string *out_error)

{
  string_view pc;
  char *pcVar1;
  int *piVar2;
  AlphaNum *in_R9;
  bool bVar3;
  string_view stream_name;
  undefined1 local_1b8 [8];
  FileInputStream file_stream;
  AlphaNum local_130;
  LineConsumer *local_100;
  size_t local_f8;
  AlphaNum local_f0;
  AlphaNum local_c0;
  string local_90;
  allocator<char> local_59;
  string local_58 [36];
  int local_34;
  string *psStack_30;
  int fd;
  string *out_error_local;
  LineConsumer *line_consumer_local;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  line_consumer_local = (LineConsumer *)path._M_len;
  psStack_30 = out_error;
  out_error_local = (string *)line_consumer;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_58,(basic_string_view<char,_std::char_traits<char>_> *)&line_consumer_local,
               &local_59);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    local_34 = open(pcVar1,0);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    bVar3 = false;
    if (local_34 < 0) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (local_34 < 0) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,"error: Unable to open \"");
    local_100 = line_consumer_local;
    local_f8 = path_local._M_len;
    pc._M_str = (char *)path_local._M_len;
    pc._M_len = (size_t)line_consumer_local;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,pc);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_130,"\", ");
    piVar2 = __errno_location();
    pcVar1 = strerror(*piVar2);
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&file_stream.impl_.backup_bytes_,pcVar1);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_90,(lts_20250127 *)&local_c0,&local_f0,&local_130,
               (AlphaNum *)&file_stream.impl_.backup_bytes_,in_R9);
    std::__cxx11::string::operator=((string *)psStack_30,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    path_local._M_str._7_1_ = 0;
  }
  else {
    io::FileInputStream::FileInputStream((FileInputStream *)local_1b8,local_34,-1);
    io::FileInputStream::SetCloseOnDelete((FileInputStream *)local_1b8,true);
    stream_name._M_str = (char *)out_error_local;
    stream_name._M_len = path_local._M_len;
    path_local._M_str._7_1_ =
         ParseSimpleStream((objectivec *)local_1b8,(ZeroCopyInputStream *)line_consumer_local,
                           stream_name,(LineConsumer *)psStack_30,(string *)in_R9);
    io::FileInputStream::~FileInputStream((FileInputStream *)local_1b8);
  }
  return (bool)(path_local._M_str._7_1_ & 1);
}

Assistant:

bool ParseSimpleFile(absl::string_view path, LineConsumer* line_consumer,
                     std::string* out_error) {
  int fd;
  do {
    fd = posix::open(std::string(path).c_str(), O_RDONLY);
  } while (fd < 0 && errno == EINTR);
  if (fd < 0) {
    *out_error =
        absl::StrCat("error: Unable to open \"", path, "\", ", strerror(errno));
    return false;
  }
  io::FileInputStream file_stream(fd);
  file_stream.SetCloseOnDelete(true);

  return ParseSimpleStream(file_stream, path, line_consumer, out_error);
}